

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeComment(XmlWriter *this,StringRef text,XmlFormatting fmt)

{
  StringRef str;
  bool bVar1;
  ostream *poVar2;
  undefined4 in_ECX;
  undefined8 in_RDX;
  XmlWriter *in_RSI;
  XmlWriter *in_RDI;
  XmlWriter *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  ensureTagClosed(in_stack_ffffffffffffffd0);
  bVar1 = anon_unknown_26::shouldIndent(None);
  if (bVar1) {
    std::operator<<(in_RDI->m_os,(string *)&in_RDI->m_indent);
  }
  std::operator<<(in_RDI->m_os,"<!-- ");
  str.m_size._0_4_ = in_stack_ffffffffffffffe0;
  str.m_start = (char *)in_RDX;
  str.m_size._4_4_ = in_ECX;
  poVar2 = Catch::operator<<((ostream *)in_RSI,str);
  std::operator<<(poVar2," -->");
  applyFormatting(in_RSI,(XmlFormatting)((ulong)in_RDI >> 0x20));
  return in_RDI;
}

Assistant:

XmlWriter& XmlWriter::writeComment( StringRef text, XmlFormatting fmt ) {
        ensureTagClosed();
        if (shouldIndent(fmt)) {
            m_os << m_indent;
        }
        m_os << "<!-- " << text << " -->";
        applyFormatting(fmt);
        return *this;
    }